

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_sse2.c
# Opt level: O1

void av1_wedge_compute_delta_squares_sse2(int16_t *d,int16_t *a,int16_t *b,int N)

{
  int16_t *piVar1;
  int16_t *piVar2;
  int16_t *piVar3;
  int16_t *piVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  auVar5 = _DAT_00561510;
  lVar6 = 0;
  do {
    auVar12 = *(undefined1 (*) [16])(a + lVar6);
    auVar18 = *(undefined1 (*) [16])(a + lVar6 + 8);
    auVar7 = *(undefined1 (*) [16])(a + lVar6 + 0x10);
    auVar33 = *(undefined1 (*) [16])(a + lVar6 + 0x18);
    piVar1 = b + lVar6;
    piVar2 = b + lVar6 + 8;
    piVar3 = b + lVar6 + 0x10;
    piVar4 = b + lVar6 + 0x18;
    auVar32._0_12_ = auVar12._0_12_;
    auVar32._12_2_ = auVar12._6_2_;
    auVar32._14_2_ = piVar1[3];
    auVar31._12_4_ = auVar32._12_4_;
    auVar31._0_10_ = auVar12._0_10_;
    auVar31._10_2_ = piVar1[2];
    auVar30._10_6_ = auVar31._10_6_;
    auVar30._0_8_ = auVar12._0_8_;
    auVar30._8_2_ = auVar12._4_2_;
    auVar29._8_8_ = auVar30._8_8_;
    auVar29._6_2_ = piVar1[1];
    auVar29._4_2_ = auVar12._2_2_;
    auVar29._0_2_ = auVar12._0_2_;
    auVar29._2_2_ = *piVar1;
    auVar19._2_2_ = piVar1[4];
    auVar19._0_2_ = auVar12._8_2_;
    auVar19._4_2_ = auVar12._10_2_;
    auVar19._6_2_ = piVar1[5];
    auVar19._8_2_ = auVar12._12_2_;
    auVar19._10_2_ = piVar1[6];
    auVar19._12_2_ = auVar12._14_2_;
    auVar19._14_2_ = piVar1[7];
    auVar25._0_12_ = auVar18._0_12_;
    auVar25._12_2_ = auVar18._6_2_;
    auVar25._14_2_ = piVar2[3];
    auVar24._12_4_ = auVar25._12_4_;
    auVar24._0_10_ = auVar18._0_10_;
    auVar24._10_2_ = piVar2[2];
    auVar23._10_6_ = auVar24._10_6_;
    auVar23._0_8_ = auVar18._0_8_;
    auVar23._8_2_ = auVar18._4_2_;
    auVar22._8_8_ = auVar23._8_8_;
    auVar22._6_2_ = piVar2[1];
    auVar22._4_2_ = auVar18._2_2_;
    auVar22._0_2_ = auVar18._0_2_;
    auVar22._2_2_ = *piVar2;
    auVar28._2_2_ = piVar2[4];
    auVar28._0_2_ = auVar18._8_2_;
    auVar28._4_2_ = auVar18._10_2_;
    auVar28._6_2_ = piVar2[5];
    auVar28._8_2_ = auVar18._12_2_;
    auVar28._10_2_ = piVar2[6];
    auVar28._12_2_ = auVar18._14_2_;
    auVar28._14_2_ = piVar2[7];
    auVar16._0_12_ = auVar7._0_12_;
    auVar16._12_2_ = auVar7._6_2_;
    auVar16._14_2_ = piVar3[3];
    auVar15._12_4_ = auVar16._12_4_;
    auVar15._0_10_ = auVar7._0_10_;
    auVar15._10_2_ = piVar3[2];
    auVar14._10_6_ = auVar15._10_6_;
    auVar14._0_8_ = auVar7._0_8_;
    auVar14._8_2_ = auVar7._4_2_;
    auVar13._8_8_ = auVar14._8_8_;
    auVar13._6_2_ = piVar3[1];
    auVar13._4_2_ = auVar7._2_2_;
    auVar13._0_2_ = auVar7._0_2_;
    auVar13._2_2_ = *piVar3;
    auVar18._2_2_ = piVar3[4];
    auVar18._0_2_ = auVar7._8_2_;
    auVar18._4_2_ = auVar7._10_2_;
    auVar18._6_2_ = piVar3[5];
    auVar18._8_2_ = auVar7._12_2_;
    auVar18._10_2_ = piVar3[6];
    auVar18._12_2_ = auVar7._14_2_;
    auVar18._14_2_ = piVar3[7];
    auVar10._0_12_ = auVar33._0_12_;
    auVar10._12_2_ = auVar33._6_2_;
    auVar10._14_2_ = piVar4[3];
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_10_ = auVar33._0_10_;
    auVar9._10_2_ = piVar4[2];
    auVar21._10_6_ = auVar9._10_6_;
    auVar21._0_8_ = auVar33._0_8_;
    auVar21._8_2_ = auVar33._4_2_;
    auVar8._8_8_ = auVar21._8_8_;
    auVar8._6_2_ = piVar4[1];
    auVar8._4_2_ = auVar33._2_2_;
    auVar8._0_2_ = auVar33._0_2_;
    auVar8._2_2_ = *piVar4;
    auVar12._2_2_ = piVar4[4];
    auVar12._0_2_ = auVar33._8_2_;
    auVar12._4_2_ = auVar33._10_2_;
    auVar12._6_2_ = piVar4[5];
    auVar12._8_2_ = auVar33._12_2_;
    auVar12._10_2_ = piVar4[6];
    auVar12._12_2_ = auVar33._14_2_;
    auVar12._14_2_ = piVar4[7];
    auVar7 = auVar29 ^ auVar5;
    auVar33._0_2_ = auVar7._0_2_;
    auVar33._2_2_ = auVar7._2_2_ + 1;
    auVar33._4_2_ = auVar7._4_2_;
    auVar33._6_2_ = auVar7._6_2_ + 1;
    auVar33._8_2_ = auVar7._8_2_;
    auVar33._10_2_ = auVar7._10_2_ + 1;
    auVar33._12_2_ = auVar7._12_2_;
    auVar33._14_2_ = auVar7._14_2_ + 1;
    auVar7 = pmaddwd(auVar33,auVar29);
    auVar33 = auVar19 ^ auVar5;
    auVar34._0_2_ = auVar33._0_2_;
    auVar34._2_2_ = auVar33._2_2_ + 1;
    auVar34._4_2_ = auVar33._4_2_;
    auVar34._6_2_ = auVar33._6_2_ + 1;
    auVar34._8_2_ = auVar33._8_2_;
    auVar34._10_2_ = auVar33._10_2_ + 1;
    auVar34._12_2_ = auVar33._12_2_;
    auVar34._14_2_ = auVar33._14_2_ + 1;
    auVar33 = pmaddwd(auVar34,auVar19);
    auVar33 = packssdw(auVar7,auVar33);
    auVar7 = auVar22 ^ auVar5;
    auVar20._0_2_ = auVar7._0_2_;
    auVar20._2_2_ = auVar7._2_2_ + 1;
    auVar20._4_2_ = auVar7._4_2_;
    auVar20._6_2_ = auVar7._6_2_ + 1;
    auVar20._8_2_ = auVar7._8_2_;
    auVar20._10_2_ = auVar7._10_2_ + 1;
    auVar20._12_2_ = auVar7._12_2_;
    auVar20._14_2_ = auVar7._14_2_ + 1;
    auVar7 = pmaddwd(auVar20,auVar22);
    auVar26 = auVar28 ^ auVar5;
    auVar27._0_2_ = auVar26._0_2_;
    auVar27._2_2_ = auVar26._2_2_ + 1;
    auVar27._4_2_ = auVar26._4_2_;
    auVar27._6_2_ = auVar26._6_2_ + 1;
    auVar27._8_2_ = auVar26._8_2_;
    auVar27._10_2_ = auVar26._10_2_ + 1;
    auVar27._12_2_ = auVar26._12_2_;
    auVar27._14_2_ = auVar26._14_2_ + 1;
    auVar28 = pmaddwd(auVar27,auVar28);
    auVar21 = packssdw(auVar7,auVar28);
    auVar7 = auVar13 ^ auVar5;
    auVar26._0_2_ = auVar7._0_2_;
    auVar26._2_2_ = auVar7._2_2_ + 1;
    auVar26._4_2_ = auVar7._4_2_;
    auVar26._6_2_ = auVar7._6_2_ + 1;
    auVar26._8_2_ = auVar7._8_2_;
    auVar26._10_2_ = auVar7._10_2_ + 1;
    auVar26._12_2_ = auVar7._12_2_;
    auVar26._14_2_ = auVar7._14_2_ + 1;
    auVar7 = pmaddwd(auVar26,auVar13);
    auVar28 = auVar18 ^ auVar5;
    auVar17._0_2_ = auVar28._0_2_;
    auVar17._2_2_ = auVar28._2_2_ + 1;
    auVar17._4_2_ = auVar28._4_2_;
    auVar17._6_2_ = auVar28._6_2_ + 1;
    auVar17._8_2_ = auVar28._8_2_;
    auVar17._10_2_ = auVar28._10_2_ + 1;
    auVar17._12_2_ = auVar28._12_2_;
    auVar17._14_2_ = auVar28._14_2_ + 1;
    auVar18 = pmaddwd(auVar17,auVar18);
    auVar28 = packssdw(auVar7,auVar18);
    auVar18 = auVar8 ^ auVar5;
    auVar7._0_2_ = auVar18._0_2_;
    auVar7._2_2_ = auVar18._2_2_ + 1;
    auVar7._4_2_ = auVar18._4_2_;
    auVar7._6_2_ = auVar18._6_2_ + 1;
    auVar7._8_2_ = auVar18._8_2_;
    auVar7._10_2_ = auVar18._10_2_ + 1;
    auVar7._12_2_ = auVar18._12_2_;
    auVar7._14_2_ = auVar18._14_2_ + 1;
    auVar18 = pmaddwd(auVar7,auVar8);
    auVar7 = auVar12 ^ auVar5;
    auVar11._0_2_ = auVar7._0_2_;
    auVar11._2_2_ = auVar7._2_2_ + 1;
    auVar11._4_2_ = auVar7._4_2_;
    auVar11._6_2_ = auVar7._6_2_ + 1;
    auVar11._8_2_ = auVar7._8_2_;
    auVar11._10_2_ = auVar7._10_2_ + 1;
    auVar11._12_2_ = auVar7._12_2_;
    auVar11._14_2_ = auVar7._14_2_ + 1;
    auVar12 = pmaddwd(auVar11,auVar12);
    auVar12 = packssdw(auVar18,auVar12);
    *(undefined1 (*) [16])(d + lVar6) = auVar33;
    *(undefined1 (*) [16])(d + lVar6 + 8) = auVar21;
    *(undefined1 (*) [16])(d + lVar6 + 0x10) = auVar28;
    *(undefined1 (*) [16])(d + lVar6 + 0x18) = auVar12;
    lVar6 = lVar6 + 0x20;
  } while (N != (int)lVar6);
  return;
}

Assistant:

void av1_wedge_compute_delta_squares_sse2(int16_t *d, const int16_t *a,
                                          const int16_t *b, int N) {
  const __m128i v_neg_w = _mm_set_epi16((short)0xffff, 0, (short)0xffff, 0,
                                        (short)0xffff, 0, (short)0xffff, 0);

  assert(N % 64 == 0);

  do {
    const __m128i v_a0_w = xx_load_128(a);
    const __m128i v_b0_w = xx_load_128(b);
    const __m128i v_a1_w = xx_load_128(a + 8);
    const __m128i v_b1_w = xx_load_128(b + 8);
    const __m128i v_a2_w = xx_load_128(a + 16);
    const __m128i v_b2_w = xx_load_128(b + 16);
    const __m128i v_a3_w = xx_load_128(a + 24);
    const __m128i v_b3_w = xx_load_128(b + 24);

    const __m128i v_ab0l_w = _mm_unpacklo_epi16(v_a0_w, v_b0_w);
    const __m128i v_ab0h_w = _mm_unpackhi_epi16(v_a0_w, v_b0_w);
    const __m128i v_ab1l_w = _mm_unpacklo_epi16(v_a1_w, v_b1_w);
    const __m128i v_ab1h_w = _mm_unpackhi_epi16(v_a1_w, v_b1_w);
    const __m128i v_ab2l_w = _mm_unpacklo_epi16(v_a2_w, v_b2_w);
    const __m128i v_ab2h_w = _mm_unpackhi_epi16(v_a2_w, v_b2_w);
    const __m128i v_ab3l_w = _mm_unpacklo_epi16(v_a3_w, v_b3_w);
    const __m128i v_ab3h_w = _mm_unpackhi_epi16(v_a3_w, v_b3_w);

    // Negate top word of pairs
    const __m128i v_abl0n_w = negm_epi16(v_ab0l_w, v_neg_w);
    const __m128i v_abh0n_w = negm_epi16(v_ab0h_w, v_neg_w);
    const __m128i v_abl1n_w = negm_epi16(v_ab1l_w, v_neg_w);
    const __m128i v_abh1n_w = negm_epi16(v_ab1h_w, v_neg_w);
    const __m128i v_abl2n_w = negm_epi16(v_ab2l_w, v_neg_w);
    const __m128i v_abh2n_w = negm_epi16(v_ab2h_w, v_neg_w);
    const __m128i v_abl3n_w = negm_epi16(v_ab3l_w, v_neg_w);
    const __m128i v_abh3n_w = negm_epi16(v_ab3h_w, v_neg_w);

    const __m128i v_r0l_w = _mm_madd_epi16(v_ab0l_w, v_abl0n_w);
    const __m128i v_r0h_w = _mm_madd_epi16(v_ab0h_w, v_abh0n_w);
    const __m128i v_r1l_w = _mm_madd_epi16(v_ab1l_w, v_abl1n_w);
    const __m128i v_r1h_w = _mm_madd_epi16(v_ab1h_w, v_abh1n_w);
    const __m128i v_r2l_w = _mm_madd_epi16(v_ab2l_w, v_abl2n_w);
    const __m128i v_r2h_w = _mm_madd_epi16(v_ab2h_w, v_abh2n_w);
    const __m128i v_r3l_w = _mm_madd_epi16(v_ab3l_w, v_abl3n_w);
    const __m128i v_r3h_w = _mm_madd_epi16(v_ab3h_w, v_abh3n_w);

    const __m128i v_r0_w = _mm_packs_epi32(v_r0l_w, v_r0h_w);
    const __m128i v_r1_w = _mm_packs_epi32(v_r1l_w, v_r1h_w);
    const __m128i v_r2_w = _mm_packs_epi32(v_r2l_w, v_r2h_w);
    const __m128i v_r3_w = _mm_packs_epi32(v_r3l_w, v_r3h_w);

    xx_store_128(d, v_r0_w);
    xx_store_128(d + 8, v_r1_w);
    xx_store_128(d + 16, v_r2_w);
    xx_store_128(d + 24, v_r3_w);

    a += 32;
    b += 32;
    d += 32;
    N -= 32;
  } while (N);
}